

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaos.c
# Opt level: O0

void chaos_weapon_prices(dw_rom *rom)

{
  double dVar1;
  int local_14;
  int i;
  dw_rom *rom_local;
  
  if ((rom->flags[1] & 0xc) != 0) {
    for (local_14 = 0; local_14 < 0x11; local_14 = local_14 + 1) {
      dVar1 = mt_rand_double_ranged(1.0,15.0);
      dVar1 = polyfit(dVar1,&wpn_price_fac);
      rom->weapon_prices[local_14] = (uint16_t)(int)dVar1;
      rom->weapon_price_display[local_14] = (uint16_t)(int)dVar1;
    }
  }
  return;
}

Assistant:

static void chaos_weapon_prices(dw_rom *rom)
{
    int i;

    if (!RANDOM_PRICES(rom))
        return;

    for (i=0; i < 17; i++) {
        rom->weapon_price_display[i] = rom->weapon_prices[i] =
            (uint16_t)polyfit(mt_rand_double_ranged(1,15), &wpn_price_fac);
    }
}